

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

SampledSpectrum * phyr::SampledSpectrum::getFromSample(double *lambda,double *v,int n)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  int in_ECX;
  double *in_RDX;
  double *in_RSI;
  SampledSpectrum *in_RDI;
  vector<double,_std::allocator<double>_> vv;
  vector<double,_std::allocator<double>_> vl;
  undefined8 in_stack_ffffffffffffff50;
  int n_00;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  double *lambda_00;
  allocator_type *in_stack_ffffffffffffff68;
  allocator_type *__a;
  double *__first;
  allocator_type local_61;
  allocator_type local_60 [20];
  int in_stack_ffffffffffffffb4;
  double *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  undefined1 local_31 [29];
  int local_14;
  double *local_10;
  double *local_8;
  
  n_00 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  bVar1 = isSampleSpaceSorted(in_RSI,in_ECX);
  if (bVar1) {
    _getFromSample(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,n_00);
  }
  else {
    __first = local_8 + (local_14 + -1);
    pvVar2 = (vector<double,_std::allocator<double>_> *)local_31;
    std::allocator<double>::allocator((allocator<double> *)0x10a438);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              (pvVar2,__first,local_8,in_stack_ffffffffffffff68);
    std::allocator<double>::~allocator((allocator<double> *)0x10a463);
    lambda_00 = local_10 + (local_14 + -1);
    __a = &local_61;
    std::allocator<double>::allocator((allocator<double> *)0x10a494);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              (pvVar2,__first,local_8,__a);
    std::allocator<double>::~allocator((allocator<double> *)0x10a4b9);
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_31 + 1),0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_60,0);
    sortSampleSpace(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_31 + 1),0);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_60,0);
    _getFromSample(lambda_00,local_10,(int)((ulong)pvVar2 >> 0x20));
    std::vector<double,_std::allocator<double>_>::~vector(pvVar2);
    std::vector<double,_std::allocator<double>_>::~vector(pvVar2);
  }
  return in_RDI;
}

Assistant:

SampledSpectrum SampledSpectrum::getFromSample(const Real* lambda, const Real* v, int n) {
    // Generate sorted sample space
    if (!isSampleSpaceSorted(lambda, n)) {
        std::vector<Real> vl(&lambda[0], &lambda[n-1]);
        std::vector<Real> vv(&v[0], &v[n-1]);

        sortSampleSpace(&vl[0], &vv[0], n);
        return _getFromSample(&vl[0], &vv[0], n);
    }

    return _getFromSample(lambda, v, n);
}